

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visitor_tmpl_impl.hpp
# Opt level: O1

AVisitor<hiberlite::UpdateBean> * __thiscall
hiberlite::AVisitor<hiberlite::UpdateBean>::operator&
          (AVisitor<hiberlite::UpdateBean> *this,sql_nvp<double> *nvp)

{
  pointer pcVar1;
  string local_50;
  db_atom<double> local_30;
  
  pcVar1 = (nvp->name)._M_dataplus._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + (nvp->name)._M_string_length);
  divePrefix(this,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  local_30.val = nvp->value;
  local_30.super_abstract_atom._vptr_abstract_atom = (_func_int **)&PTR_bindValue_00199778;
  UpdateBean::act<hiberlite::AVisitor<hiberlite::UpdateBean>,double>(this->actor,this,&local_30);
  popScope(this);
  return this;
}

Assistant:

AVisitor<C>& AVisitor<C>::operator&(sql_nvp<X> nvp)
{
	divePrefix(nvp.name);
		walk(nvp.value);
	pop();
	return *this;
}